

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O2

void Ptex::v2_2::(anonymous_namespace)::ApplyS<Ptex::v2_2::PtexHalf,1>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int nTxChan)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ushort *puVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar1 = k->A;
  iVar9 = k->v1;
  iVar5 = -iVar9;
  for (; iVar9 != k->v2; iVar9 = iVar9 + 1) {
    iVar2 = k->rowlen;
    iVar3 = k->u1;
    iVar8 = (iVar2 - iVar9) - k->w2;
    if (iVar8 < iVar3) {
      iVar8 = iVar3;
    }
    iVar7 = (iVar2 - iVar9) - k->w1;
    if (k->u2 < iVar7) {
      iVar7 = k->u2;
    }
    fVar10 = (float)iVar8 - k->u;
    fVar11 = (float)iVar9 - k->v;
    fVar12 = (fVar10 + fVar10 + 1.0) * k->A + fVar11 * k->B;
    fVar10 = k->A * fVar10 * fVar10 + (k->B * fVar10 + k->C * fVar11) * fVar11;
    iVar4 = (iVar2 + iVar5) - k->w2;
    if (iVar4 < iVar3) {
      iVar4 = iVar3;
    }
    for (puVar6 = (ushort *)((long)data + (long)((iVar4 + iVar2 * iVar9) * nTxChan) * 2);
        puVar6 < (ushort *)
                 ((long)data +
                 (long)((iVar7 - iVar8) * nTxChan) * 2 +
                 (long)((iVar8 + iVar2 * iVar9) * nTxChan) * 2); puVar6 = puVar6 + nTxChan) {
      if (fVar10 < 1.0) {
        fVar11 = anon_unknown_2::gaussian(fVar10);
        fVar11 = fVar11 * k->wscale;
        k->weight = k->weight + fVar11;
        *result = fVar11 * *(float *)(PtexHalf::h2fTable + (ulong)*puVar6 * 4) + *result;
      }
      fVar10 = fVar10 + fVar12;
      fVar12 = fVar12 + fVar1 + fVar1;
    }
    iVar5 = iVar5 + -1;
  }
  return;
}

Assistant:

void ApplyS(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int nTxChan)
    {
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }